

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cupdlp_utils.c
# Opt level: O2

void dense2csc(CUPDLPcsc *csc,CUPDLPdense *dense)

{
  double dVar1;
  cupdlp_int *pcVar2;
  cupdlp_float *pcVar3;
  long lVar4;
  int iVar5;
  int iVar6;
  long lVar7;
  cupdlp_int cVar8;
  
  cVar8 = dense->nCols;
  csc->nRows = dense->nRows;
  csc->nCols = cVar8;
  pcVar2 = csc->colMatBeg;
  *pcVar2 = 0;
  iVar5 = 0;
  for (lVar4 = 0; lVar4 < csc->nCols; lVar4 = lVar4 + 1) {
    cVar8 = csc->nRows;
    for (lVar7 = 0; iVar6 = (int)lVar7, iVar6 < cVar8; lVar7 = lVar7 + 1) {
      pcVar3 = dense->data;
      dVar1 = pcVar3[(int)lVar4 * cVar8 + iVar6];
      if ((dVar1 != 0.0) || (NAN(dVar1))) {
        csc->colMatIdx[iVar5] = iVar6;
        cVar8 = csc->nRows;
        csc->colMatElem[iVar5] = pcVar3[(int)lVar4 * cVar8 + lVar7];
        iVar5 = iVar5 + 1;
      }
    }
    pcVar2[lVar4 + 1] = iVar5;
  }
  csc->nMatElem = iVar5;
  return;
}

Assistant:

void dense2csc(CUPDLPcsc *csc, CUPDLPdense *dense) {
  csc->nRows = dense->nRows;
  csc->nCols = dense->nCols;

  cupdlp_int nnz = 0;
  cupdlp_int iCol = 0;
  cupdlp_int iRow = 0;
  csc->colMatBeg[0] = 0;
  for (iCol = 0; iCol < csc->nCols; ++iCol) {
    for (iRow = 0; iRow < csc->nRows; ++iRow) {
      if (dense->data[iCol * csc->nRows + iRow] != 0) {
        csc->colMatIdx[nnz] = iRow;
        csc->colMatElem[nnz] = dense->data[iCol * csc->nRows + iRow];
        ++nnz;
      }
    }
    csc->colMatBeg[iCol + 1] = nnz;
  }

  csc->nMatElem = nnz;

  return;
}